

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

nng_dialer nng_pipe_dialer(nng_pipe p)

{
  nng_err nVar1;
  uint32_t uVar2;
  nni_pipe *in_RAX;
  nni_pipe *local_18;
  nni_pipe *pipe;
  
  local_18 = in_RAX;
  nVar1 = nni_pipe_find(&local_18,p.id);
  uVar2 = 0;
  if (nVar1 == NNG_OK) {
    uVar2 = nni_pipe_dialer_id(local_18);
    nni_pipe_rele(local_18);
  }
  return (nng_dialer)uVar2;
}

Assistant:

nng_dialer
nng_pipe_dialer(nng_pipe p)
{
	nng_dialer d = NNG_DIALER_INITIALIZER;
	nni_pipe  *pipe;
	if (nni_pipe_find(&pipe, p.id) == 0) {
		d.id = nni_pipe_dialer_id(pipe);
		nni_pipe_rele(pipe);
	}
	return (d);
}